

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool operator_float_rem(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_value_t gVar3;
  gravity_value_t gVar4;
  char local_1028 [4096];
  
  gVar4 = args[1];
  gVar3 = convert_value2float(vm,*args);
  if (gVar3.isa != (gravity_class_t *)0x0) {
    gVar4 = convert_value2float(vm,gVar4);
    pgVar1 = gravity_class_float;
    if (gVar4.isa != (gravity_class_t *)0x0) {
      aVar2.f = remainder(gVar3.field_1.f,gVar4.field_1.f);
      gVar4.field_1.n = aVar2.n;
      gVar4.isa = pgVar1;
      gravity_vm_setslot(vm,gVar4,rindex);
      return true;
    }
  }
  builtin_strncpy(local_1028,"Unable to convert object to Float",0x22);
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,local_1028);
  gVar3.field_1.n = 0;
  gVar3.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar3,rindex);
  return false;
}

Assistant:

static bool operator_float_rem (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v1, true);
    INTERNAL_CONVERT_FLOAT(v2, true);

    // compute floating point modulus
    #if GRAVITY_ENABLE_DOUBLE
    RETURN_VALUE(VALUE_FROM_FLOAT(remainder(v1.f, v2.f)), rindex);
    #else
    RETURN_VALUE(VALUE_FROM_FLOAT(remainderf(v1.f, v2.f)), rindex);
    #endif
}